

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_archivable_dictionary.cpp
# Opt level: O0

char * __thiscall
ON_ArchivableDictionaryPrivate::SetValue<signed_char>
          (ON_ArchivableDictionaryPrivate *this,wchar_t *key,char *value)

{
  char cVar1;
  int iVar2;
  pointer ppVar3;
  pointer pDVar4;
  DictionaryEntryT<signed_char,_(DictionaryEntryType)3> *pDVar5;
  reference pcVar6;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  pVar7;
  unique_ptr<Entry<signed_char>,_std::default_delete<Entry<signed_char>_>_> local_80;
  unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>> *local_78;
  unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *entry_ptr;
  undefined1 local_68;
  void *local_50;
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>
  local_48;
  _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
  local_38;
  pair<std::_Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>,_bool>
  r;
  char *value_local;
  wchar_t *key_local;
  ON_ArchivableDictionaryPrivate *this_local;
  
  local_50 = (void *)0x0;
  r._8_8_ = value;
  value_local = (char *)key;
  key_local = (wchar_t *)this;
  std::
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>::
  pair<const_wchar_t_*&,_std::nullptr_t,_true>(&local_48,(wchar_t **)&value_local,&local_50);
  pVar7 = std::
          map<ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>,_std::less<void>,_std::allocator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>_>
          ::insert(&this->m_map,&local_48);
  entry_ptr = (unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
              pVar7.first._M_node;
  local_68 = pVar7.second;
  local_38._M_node = (_Base_ptr)entry_ptr;
  r.first._M_node._0_1_ = local_68;
  std::
  pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>::
  ~pair(&local_48);
  ppVar3 = std::
           _Rb_tree_iterator<std::pair<const_ON_wString,_std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>_>_>
           ::operator->(&local_38);
  local_78 = (unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>> *)&ppVar3->second;
  if (((byte)r.first._M_node & 1) == 0) {
    pDVar4 = std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::operator->
                       ((unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
                        local_78);
    iVar2 = (*pDVar4->_vptr_DictionaryEntry[2])();
    if (iVar2 == 3) {
      cVar1 = *(char *)r._8_8_;
      pDVar5 = (DictionaryEntryT<signed_char,_(DictionaryEntryType)3> *)
               std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::get
                         ((unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)
                          local_78);
      pcVar6 = DictionaryEntryT<signed_char,_(DictionaryEntryType)3>::Value(pDVar5);
      *pcVar6 = cVar1;
      return pcVar6;
    }
  }
  make_entry<signed_char>((char *)&local_80);
  std::unique_ptr<DictionaryEntry,std::default_delete<DictionaryEntry>>::operator=
            (local_78,&local_80);
  std::unique_ptr<Entry<signed_char>,_std::default_delete<Entry<signed_char>_>_>::~unique_ptr
            (&local_80);
  pDVar5 = (DictionaryEntryT<signed_char,_(DictionaryEntryType)3> *)
           std::unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_>::get
                     ((unique_ptr<DictionaryEntry,_std::default_delete<DictionaryEntry>_> *)local_78
                     );
  pcVar6 = DictionaryEntryT<signed_char,_(DictionaryEntryType)3>::Value(pDVar5);
  return pcVar6;
}

Assistant:

const T& SetValue(const wchar_t* key, const T& value)
  {
    auto r = m_map.insert({ key, nullptr });
    auto& entry_ptr = r.first->second;

    if (!r.second && entry_ptr->EntryType() == Entry<T>::Type)
    {
      return static_cast<Entry<T>*>(entry_ptr.get())->Value() = value;
    }
    else
    {
      entry_ptr = make_entry(value);
      return static_cast<Entry<T>*>(entry_ptr.get())->Value();
    }
  }